

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O3

int mbedtls_entropy_gather(mbedtls_entropy_context *ctx)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  size_t sStack_c0;
  uchar auStack_b8 [136];
  
  if (ctx->source_count == 0) {
    return -0x40;
  }
  if (ctx->source_count < 1) {
    iVar2 = -0x3d;
  }
  else {
    piVar3 = &ctx->source[0].strong;
    lVar4 = 0;
    bVar1 = false;
    do {
      if (*piVar3 == 1) {
        bVar1 = true;
      }
      sStack_c0 = 0;
      iVar2 = (*((mbedtls_entropy_source_state *)(piVar3 + -8))->f_source)
                        (*(void **)(piVar3 + -6),auStack_b8,0x80,&sStack_c0);
      if (iVar2 != 0) goto LAB_0012e05d;
      if (sStack_c0 != 0) {
        iVar2 = entropy_update(ctx,(uchar)lVar4,auStack_b8,sStack_c0);
        if (iVar2 != 0) {
          return iVar2;
        }
        *(size_t *)(piVar3 + -4) = *(size_t *)(piVar3 + -4) + sStack_c0;
      }
      lVar4 = lVar4 + 1;
      piVar3 = piVar3 + 10;
    } while (lVar4 < ctx->source_count);
    iVar2 = -0x3d;
    if (bVar1) {
      iVar2 = 0;
    }
  }
LAB_0012e05d:
  lVar4 = 0;
  do {
    auStack_b8[lVar4] = '\0';
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x80);
  return iVar2;
}

Assistant:

int mbedtls_entropy_gather( mbedtls_entropy_context *ctx )
{
    int ret;

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    ret = entropy_gather_internal( ctx );

#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}